

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_buffer(sg_buffer buf_id,sg_buffer_desc *desc)

{
  undefined1 local_78 [8];
  sg_buffer_desc desc_def;
  sg_buffer_desc *desc_local;
  sg_buffer buf_id_local;
  
  desc_def._88_8_ = desc;
  if (_sg.valid) {
    _sg_buffer_desc_defaults((sg_buffer_desc *)local_78,desc);
    _sg_init_buffer(buf_id,(sg_buffer_desc *)local_78);
    return;
  }
  __assert_fail("_sg.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                ,0x3a49,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
}

Assistant:

inline void sg_init_buffer(sg_buffer buf_id, const sg_buffer_desc& desc) { return sg_init_buffer(buf_id, &desc); }